

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

value * __thiscall
mjs::anon_unknown_35::escape
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  uint uVar1;
  value *pvVar2;
  char *pcVar3;
  long lVar4;
  uint val;
  wchar_t wVar5;
  gc_heap_ptr_untyped local_80;
  value *local_70;
  anon_unknown_35 *local_68;
  wstring res;
  wstring_view local_40;
  
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = L'\0';
  lVar4 = 0;
  local_70 = __return_storage_ptr__;
  local_68 = this;
  do {
    if ((long)global << 2 == lVar4) {
      local_40._M_len = res._M_string_length;
      local_40._M_str = res._M_dataplus._M_p;
      string::string((string *)&local_80,*(gc_heap **)local_68,&local_40);
      pvVar2 = local_70;
      value::value(local_70,(string *)&local_80);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
      std::__cxx11::wstring::~wstring((wstring *)&res);
      return pvVar2;
    }
    uVar1 = *(uint *)(s._M_len + lVar4);
    val = uVar1 & 0xffff;
    wVar5 = (wchar_t)&res;
    if (val - 0x30 < 10 || (uVar1 & 0xffdf) - 0x41 < 0x1a) {
LAB_00145f8d:
      std::__cxx11::wstring::push_back(wVar5);
    }
    else {
      local_80.heap_._0_1_ = (undefined1)val;
      pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         ("@*_+-./","",&local_80);
      if (pcVar3 != "") goto LAB_00145f8d;
      if (val < 0x100) {
        anon_unknown_5::put_percent_hex_byte(&res,val);
      }
      else {
        std::__cxx11::wstring::push_back(wVar5);
        std::__cxx11::wstring::push_back(wVar5);
        anon_unknown_5::put_hex_byte(&res,val >> 8);
        anon_unknown_5::put_hex_byte(&res,val);
      }
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

value escape(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (uint16_t ch: s) {
        if (is_alpha_or_digit(ch) || is_in_list(ch, "@*_+-./")) {
            res.push_back(ch);
        } else if (ch > 255) {
            res.push_back('%');
            res.push_back('u');
            put_hex_byte(res, ch>>8);
            put_hex_byte(res, ch);
        } else {
            put_percent_hex_byte(res, ch);
        }
    }
    return value{string{global.heap(), res}};
}